

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O2

size_t zt_cstr_rcspn(char *s,char *reject)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar2 = strlen(s);
  sVar4 = sVar2;
  do {
    sVar1 = sVar4 - 1;
    if ((long)sVar1 < 1) {
      return sVar2;
    }
    sVar3 = strcspn(s + (sVar4 - 1),reject);
    sVar4 = sVar1;
  } while (sVar3 != 0);
  return sVar1;
}

Assistant:

size_t
zt_cstr_rcspn(const char *s, const char *reject) {
    size_t    len = strlen(s);
    ssize_t   i   = 0;

    zt_assert(s);
    zt_assert(reject);

    for (i = len - 1; i > 0; i--) { /* -1 to skip \0 */
        if (strcspn(&s[i], reject) == 0) {
            return i;                                      /* -1 for the first non matching char */
        }
    }
    return len;
}